

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::api::json::DecodePsbtResponse::ConvertFromStruct
          (DecodePsbtResponse *this,DecodePsbtResponseStruct *data)

{
  undefined8 uVar1;
  DecodeRawTransactionResponse *in_RSI;
  DecodeRawTransactionResponseStruct *in_RDI;
  vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *in_stack_00000098;
  JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *in_stack_000000a0;
  vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> *in_stack_00000138;
  JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct> *in_stack_00000140;
  vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *in_stack_000001c8;
  JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct> *in_stack_000001d0;
  vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> *in_stack_00000488;
  JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct> *in_stack_00000490;
  
  DecodeRawTransactionResponse::ConvertFromStruct(in_RSI,in_RDI);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[1].locktime,
             (string *)
             &(in_RSI->vout_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxOut>.
              super_vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
            );
  core::JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct>::ConvertFromStruct
            (in_stack_00000140,in_stack_00000138);
  in_RDI[1].ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       *(_Rb_tree_color *)
        &in_RSI[1].ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertFromStruct
            (in_stack_000000a0,in_stack_00000098);
  core::JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct>::ConvertFromStruct
            (in_stack_00000490,in_stack_00000488);
  core::JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct>::
  ConvertFromStruct(in_stack_000001d0,in_stack_000001c8);
  uVar1 = *(undefined8 *)((long)&in_RSI[1].hash_.field_2 + 8);
  in_RDI[2].version = (int)uVar1;
  in_RDI[2].size = (int)((ulong)uVar1 >> 0x20);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RSI,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RDI);
  return;
}

Assistant:

void DecodePsbtResponse::ConvertFromStruct(
    const DecodePsbtResponseStruct& data) {
  tx_.ConvertFromStruct(data.tx);
  tx_hex_ = data.tx_hex;
  xpubs_.ConvertFromStruct(data.xpubs);
  version_ = data.version;
  unknown_.ConvertFromStruct(data.unknown);
  inputs_.ConvertFromStruct(data.inputs);
  outputs_.ConvertFromStruct(data.outputs);
  fee_ = data.fee;
  ignore_items = data.ignore_items;
}